

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLDriver::draw2DRectangle
          (COpenGLDriver *this,SColor color,rect<int> *position,rect<int> *clip)

{
  rect<int> pos;
  rect<int> local_38;
  
  disableTextures(this,0);
  setRenderStates2DMode(this,color.color >> 0x18 != 0xff,false,false);
  local_38.UpperLeftCorner.X = (position->UpperLeftCorner).X;
  local_38.UpperLeftCorner.Y = (position->UpperLeftCorner).Y;
  local_38.LowerRightCorner.X = (position->LowerRightCorner).X;
  local_38.LowerRightCorner.Y = (position->LowerRightCorner).Y;
  if (clip != (rect<int> *)0x0) {
    core::rect<int>::clipAgainst(&local_38,clip);
  }
  if ((local_38.UpperLeftCorner.X <= local_38.LowerRightCorner.X) &&
     (local_38.UpperLeftCorner.Y <= local_38.LowerRightCorner.Y)) {
    glColor4ub(color.color >> 0x10 & 0xff,color.color >> 8 & 0xff,color.color & 0xff,
               color.color >> 0x18);
    glRectf((float)local_38.UpperLeftCorner.X,(float)local_38.UpperLeftCorner.Y,
            (float)local_38.LowerRightCorner.X,(float)local_38.LowerRightCorner.Y);
  }
  return;
}

Assistant:

void COpenGLDriver::draw2DRectangle(SColor color, const core::rect<s32> &position,
		const core::rect<s32> *clip)
{
	disableTextures();
	setRenderStates2DMode(color.getAlpha() < 255, false, false);

	core::rect<s32> pos = position;

	if (clip)
		pos.clipAgainst(*clip);

	if (!pos.isValid())
		return;

	glColor4ub(color.getRed(), color.getGreen(), color.getBlue(), color.getAlpha());
	glRectf(GLfloat(pos.UpperLeftCorner.X), GLfloat(pos.UpperLeftCorner.Y),
			GLfloat(pos.LowerRightCorner.X), GLfloat(pos.LowerRightCorner.Y));
}